

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O1

bool convertMetaObject(QMetaType fromType,void *from,QMetaType toType,void *to)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  QMetaObject *pQVar5;
  QMetaObject *pQVar6;
  undefined4 extraout_var;
  QObject *pQVar7;
  uint uVar8;
  long in_FS_OFFSET;
  QMetaType local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (QMetaObject *)0x0;
  uVar3 = 0;
  uVar8 = 0;
  local_38.d_ptr = toType.d_ptr;
  if (fromType.d_ptr == (QMetaTypeInterface *)0x0) {
LAB_00296179:
    if (toType.d_ptr != (QMetaTypeInterface *)0x0) {
      uVar3 = (toType.d_ptr)->flags & 0x800;
    }
    if (uVar8 == uVar3) {
      if ((fromType.d_ptr == (QMetaTypeInterface *)0x0) ||
         ((fromType.d_ptr)->metaObjectFn == (MetaObjectFn)0x0)) {
        pQVar5 = (QMetaObject *)0x0;
      }
      else {
        pQVar5 = (*(fromType.d_ptr)->metaObjectFn)(fromType.d_ptr);
      }
      if ((toType.d_ptr == (QMetaTypeInterface *)0x0) ||
         ((toType.d_ptr)->metaObjectFn == (MetaObjectFn)0x0)) {
        pQVar6 = (QMetaObject *)0x0;
      }
      else {
        pQVar6 = (*(toType.d_ptr)->metaObjectFn)(toType.d_ptr);
      }
      if ((pQVar6 != (QMetaObject *)0x0 && pQVar5 != (QMetaObject *)0x0) &&
         (bVar1 = QMetaObject::inherits(pQVar5,pQVar6), bVar1)) {
        QMetaType::destruct(&local_38,to);
        QMetaType::construct(&local_38,to,from);
        bVar2 = 1;
        goto LAB_002962cc;
      }
    }
  }
  else {
    if (((((fromType.d_ptr)->flags & 8) == 0) || (toType.d_ptr == (QMetaTypeInterface *)0x0)) ||
       (((toType.d_ptr)->flags & 8) == 0)) {
      if (fromType.d_ptr != (QMetaTypeInterface *)0x0) {
        uVar8 = (fromType.d_ptr)->flags & 0x800;
      }
      goto LAB_00296179;
    }
    pQVar7 = *from;
    if (pQVar7 == (QObject *)0x0) {
      if (((fromType.d_ptr == (QMetaTypeInterface *)0x0) ||
          (pQVar5 = (QMetaObject *)(fromType.d_ptr)->metaObjectFn, pQVar5 == (QMetaObject *)0x0)) ||
         (pQVar5 = (*(code *)pQVar5)(fromType.d_ptr), pQVar5 == (QMetaObject *)0x0))
      goto LAB_0029629d;
      *(undefined8 *)to = 0;
      if ((fromType.d_ptr == (QMetaTypeInterface *)0x0) ||
         ((fromType.d_ptr)->metaObjectFn == (MetaObjectFn)0x0)) {
        pQVar5 = (QMetaObject *)0x0;
      }
      else {
        pQVar5 = (*(fromType.d_ptr)->metaObjectFn)(fromType.d_ptr);
      }
      if ((toType.d_ptr == (QMetaTypeInterface *)0x0) ||
         ((toType.d_ptr)->metaObjectFn == (MetaObjectFn)0x0)) {
        pQVar6 = (QMetaObject *)0x0;
      }
      else {
        pQVar6 = (*(toType.d_ptr)->metaObjectFn)(toType.d_ptr);
      }
      bVar2 = QMetaObject::inherits(pQVar5,pQVar6);
LAB_002962c3:
      bVar1 = false;
    }
    else {
      iVar4 = (**pQVar7->_vptr_QObject)(pQVar7);
      if ((toType.d_ptr == (QMetaTypeInterface *)0x0) ||
         ((toType.d_ptr)->metaObjectFn == (MetaObjectFn)0x0)) {
        pQVar5 = (QMetaObject *)0x0;
      }
      else {
        pQVar5 = (*(toType.d_ptr)->metaObjectFn)(toType.d_ptr);
      }
      bVar1 = QMetaObject::inherits((QMetaObject *)CONCAT44(extraout_var,iVar4),pQVar5);
      pQVar5 = (QMetaObject *)(ulong)bVar1;
      if (bVar1) {
        pQVar5 = (*(toType.d_ptr)->metaObjectFn)(toType.d_ptr);
        pQVar7 = QMetaObject::cast(pQVar5,pQVar7);
        *(QObject **)to = pQVar7;
        bVar2 = true;
        goto LAB_002962c3;
      }
LAB_0029629d:
      bVar2 = (byte)pQVar5;
      bVar1 = true;
    }
    if (!bVar1) goto LAB_002962cc;
  }
  bVar2 = 0;
LAB_002962cc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (bool)(bVar2 & 1);
}

Assistant:

static bool convertMetaObject(QMetaType fromType, const void *from, QMetaType toType, void *to)
{
    // handle QObject conversion
    if ((fromType.flags() & QMetaType::PointerToQObject) && (toType.flags() & QMetaType::PointerToQObject)) {
        QObject *fromObject = *static_cast<QObject * const *>(from);
        // use dynamic metatype of from if possible
        if (fromObject && fromObject->metaObject()->inherits(toType.metaObject()))  {
            *static_cast<QObject **>(to) = toType.metaObject()->cast(fromObject);
            return true;
        } else if (!fromObject && fromType.metaObject()) {
            // if fromObject is null, use static fromType to check if conversion works
            *static_cast<void **>(to) = nullptr;
            return fromType.metaObject()->inherits(toType.metaObject());
        }
    } else if ((fromType.flags() & QMetaType::IsPointer) == (toType.flags() & QMetaType::IsPointer)) {
        // fromType and toType are of same 'pointedness'
        const QMetaObject *f = fromType.metaObject();
        const QMetaObject *t = toType.metaObject();
        if (f && t && f->inherits(t)) {
            toType.destruct(to);
            toType.construct(to, from);
            return true;
        }
    }
    return false;
}